

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

char * mtbdd_leaf_to_str(MTBDD leaf,char *buf,size_t buflen)

{
  char *pcVar1;
  long lVar2;
  
  lVar2 = (leaf & 0xffffffffff) * 0x10;
  pcVar1 = sylvan_mt_to_str((uint)(leaf >> 0x3f),*(uint32_t *)(nodes->data + lVar2),
                            *(uint64_t *)(nodes->data + lVar2 + 8),buf,buflen);
  return pcVar1;
}

Assistant:

char *
mtbdd_leaf_to_str(MTBDD leaf, char *buf, size_t buflen)
{
    mtbddnode_t n = MTBDD_GETNODE(leaf);
    uint32_t type = mtbddnode_gettype(n);
    uint64_t value = mtbddnode_getvalue(n);
    int complement = MTBDD_HASMARK(leaf) ? 1 : 0;

    return sylvan_mt_to_str(complement, type, value, buf, buflen);
}